

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_1::PushConstantGraphicsTestInstance::createShaderStage
          (PushConstantGraphicsTestInstance *this,DeviceInterface *vk,VkDevice device,
          BinaryCollection *programCollection,char *name,VkShaderStageFlagBits stage,
          Move<vk::Handle<(vk::HandleType)14>_> *module)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  ProgramBinary *binary;
  Handle<(vk::HandleType)14> *pHVar1;
  undefined1 local_e0 [8];
  VkPipelineShaderStageCreateInfo stageCreateInfo;
  allocator<char> local_99;
  string local_98;
  Move<vk::Handle<(vk::HandleType)14>_> local_78;
  RefData<vk::Handle<(vk::HandleType)14>_> local_58;
  VkShaderStageFlagBits local_34;
  char *pcStack_30;
  VkShaderStageFlagBits stage_local;
  char *name_local;
  BinaryCollection *programCollection_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  PushConstantGraphicsTestInstance *this_local;
  
  local_34 = stage;
  pcStack_30 = name;
  name_local = (char *)programCollection;
  programCollection_local = (BinaryCollection *)device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,name,&local_99);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(programCollection,&local_98);
  ::vk::createShaderModule(&local_78,vk,device,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_device = local_58.deleter.m_device;
  data.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=(module,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  local_e0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  stageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  stageCreateInfo._4_4_ = 0;
  stageCreateInfo.pNext._0_4_ = 0;
  stageCreateInfo.pNext._4_4_ = local_34;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&module->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  stageCreateInfo._16_8_ = pHVar1->m_internal;
  stageCreateInfo.module.m_internal = (long)"pre_main" + 4;
  stageCreateInfo.pName = (char *)0x0;
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::push_back(&this->m_shaderStage,(value_type *)local_e0);
  return;
}

Assistant:

void PushConstantGraphicsTestInstance::createShaderStage (const DeviceInterface&	vk,
														  VkDevice					device,
														  const BinaryCollection&	programCollection,
														  const char*				name,
														  VkShaderStageFlagBits		stage,
														  Move<VkShaderModule>*		module)
{
	*module = createShaderModule(vk, device, programCollection.get(name), 0);

	const vk::VkPipelineShaderStageCreateInfo	stageCreateInfo	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0u,														// VkPipelineShaderStageCreateFlags		flags;
		stage,													// VkShaderStageFlagBits				stage;
		**module,												// VkShaderModule						module;
		"main",													// const char*							pName;
		DE_NULL													// const VkSpecializationInfo*			pSpecializationInfo;
	};

	m_shaderStage.push_back(stageCreateInfo);
}